

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Input::endBitSetScalar(Input *this)

{
  HNode *pHVar1;
  _Bit_type *p_Var2;
  Node *pNVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Twine local_38;
  
  if ((this->EC)._M_value == 0) {
    pHVar1 = this->CurrentNode;
    if (pHVar1 == (HNode *)0x0) {
      __assert_fail("Val && \"isa<> used on a null pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                    ,0x69,
                    "static bool llvm::isa_impl_cl<llvm::yaml::Input::SequenceHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::SequenceHNode, From = const llvm::yaml::Input::HNode *]"
                   );
    }
    if (pHVar1->_node->TypeID == 5) {
      p_Var2 = (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      pNVar3 = (Node *)pHVar1[1]._vptr_HNode;
      uVar4 = (long)pHVar1[1]._node - (long)pNVar3 >> 3;
      if ((ulong)(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) *
          8 != uVar4) {
        __assert_fail("BitValuesUsed.size() == SQ->Entries.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                      ,0x147,"virtual void llvm::yaml::Input::endBitSetScalar()");
      }
      if (pHVar1[1]._node != pNVar3) {
        uVar5 = 1;
        uVar6 = 0;
        do {
          if ((p_Var2[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) {
            pHVar1 = (HNode *)(&pNVar3->_vptr_Node)[uVar6];
            Twine::Twine(&local_38,"unknown bit value");
            setError(this,pHVar1,&local_38);
            return;
          }
          uVar6 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar6 < uVar4);
      }
    }
  }
  return;
}

Assistant:

void Input::endBitSetScalar() {
  if (EC)
    return;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    assert(BitValuesUsed.size() == SQ->Entries.size());
    for (unsigned i = 0; i < SQ->Entries.size(); ++i) {
      if (!BitValuesUsed[i]) {
        setError(SQ->Entries[i].get(), "unknown bit value");
        return;
      }
    }
  }
}